

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_union_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_union_type_f *ptf,
               flatcc_json_printer_union_f *pf)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  char *__s;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  char *pcVar7;
  uint *puVar8;
  void *pvVar9;
  size_t __n;
  flatcc_json_printer_union_descriptor_t ud;
  char type_name [105];
  flatcc_json_printer_union_descriptor_t local_b8;
  char local_a8 [4];
  undefined1 auStack_a4 [116];
  
  uVar3 = id * 2 + 2;
  if ((uVar3 < (uint)td->vsize) &&
     (uVar6 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar3), uVar6 != 0)) {
    puVar5 = (uint *)(uVar6 + (long)td->table);
  }
  else {
    puVar5 = (uint *)0x0;
  }
  uVar3 = id * 2 + 4;
  if ((uVar3 < (uint)td->vsize) &&
     (uVar6 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar3), uVar6 != 0)) {
    puVar8 = (uint *)(uVar6 + (long)td->table);
  }
  else {
    puVar8 = (uint *)0x0;
  }
  local_b8.ttl = td->ttl;
  if (len < 0x65) {
    memcpy(local_a8,name,len);
    builtin_strncpy(local_a8 + len,"_typ",4);
    auStack_a4[len] = 0x65;
    if ((puVar8 != (uint *)0x0) && (puVar5 != (uint *)0x0)) {
      flatcc_json_printer_utype_enum_vector_field(ctx,td,id + -1,local_a8,len + 5,ptf);
      iVar2 = td->count;
      td->count = iVar2 + 1;
      if (iVar2 != 0) {
        pcVar7 = ctx->p;
        ctx->p = pcVar7 + 1;
        *pcVar7 = ',';
      }
      uVar6 = (ulong)*puVar8;
      uVar3 = *puVar5;
      iVar2 = *(int *)((long)puVar8 + uVar6);
      print_name(ctx,name,len);
      ctx->level = ctx->level + 1;
      pcVar7 = ctx->p;
      ctx->p = pcVar7 + 1;
      *pcVar7 = '[';
      if (iVar2 != 0) {
        uVar1 = *(uint8_t *)((long)puVar5 + (ulong)uVar3 + 4);
        if (uVar1 == '\0') {
          pcVar7 = ctx->p;
          ctx->p = pcVar7 + 1;
          *pcVar7 = 'n';
          pcVar7 = ctx->p;
          ctx->p = pcVar7 + 1;
          *pcVar7 = 'u';
          pcVar7 = ctx->p;
          ctx->p = pcVar7 + 1;
          *pcVar7 = 'l';
          pcVar7 = ctx->p;
          ctx->p = pcVar7 + 1;
          *pcVar7 = 'l';
        }
        else {
          local_b8.member = (void *)((long)puVar8 + uVar6 + 4);
          local_b8.type = uVar1;
          (*pf)(ctx,&local_b8);
        }
        if (iVar2 != 1) {
          pvVar9 = (void *)((long)puVar8 + uVar6 + 8);
          lVar4 = 0;
          do {
            uVar1 = *(uint8_t *)((long)puVar5 + lVar4 + (ulong)uVar3 + 5);
            pcVar7 = ctx->p;
            ctx->p = pcVar7 + 1;
            *pcVar7 = ',';
            if (uVar1 == '\0') {
              pcVar7 = ctx->p;
              ctx->p = pcVar7 + 1;
              *pcVar7 = 'n';
              pcVar7 = ctx->p;
              ctx->p = pcVar7 + 1;
              *pcVar7 = 'u';
              pcVar7 = ctx->p;
              ctx->p = pcVar7 + 1;
              *pcVar7 = 'l';
              pcVar7 = ctx->p;
              ctx->p = pcVar7 + 1;
              *pcVar7 = 'l';
            }
            else {
              local_b8.member = pvVar9;
              local_b8.type = uVar1;
              (*pf)(ctx,&local_b8);
            }
            lVar4 = lVar4 + 1;
            pvVar9 = (void *)((long)pvVar9 + 4);
          } while (iVar2 + -1 != (int)lVar4);
        }
      }
      pcVar7 = ctx->p;
      if (ctx->indent != '\0') {
        ctx->p = pcVar7 + 1;
        *pcVar7 = '\n';
        lVar4 = (long)ctx->level + -1;
        ctx->level = (int)lVar4;
        uVar6 = (ulong)ctx->indent * lVar4;
        pcVar7 = ctx->pflush;
        __s = ctx->p;
        if (pcVar7 < __s + uVar6) {
          if (pcVar7 <= __s) {
            (*ctx->flush)(ctx,0);
            pcVar7 = ctx->pflush;
            __s = ctx->p;
          }
          __n = (long)pcVar7 - (long)__s;
          if (__n < uVar6) {
            do {
              memset(__s,0x20,__n);
              ctx->p = ctx->p + __n;
              uVar6 = uVar6 - __n;
              (*ctx->flush)(ctx,0);
              __s = ctx->p;
              __n = (long)ctx->pflush - (long)__s;
            } while (__n < uVar6);
          }
        }
        memset(__s,0x20,uVar6);
        pcVar7 = ctx->p + uVar6;
      }
      ctx->p = pcVar7 + 1;
      *pcVar7 = ']';
    }
    return;
  }
  if (ctx->error == 0) {
    ctx->error = 1;
  }
  __assert_fail("0 && \"identifier too long\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                ,0x41c,
                "void flatcc_json_printer_union_vector_field(flatcc_json_printer_t *, flatcc_json_printer_table_descriptor_t *, int, const char *, size_t, flatcc_json_printer_union_type_f *, flatcc_json_printer_union_f *)"
               );
}

Assistant:

void flatcc_json_printer_union_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        flatcc_json_printer_union_type_f ptf,
        flatcc_json_printer_union_f pf)
{
    const uoffset_t *pt = get_field_ptr(td, id - 1);
    const uoffset_t *p = get_field_ptr(td, id);
    utype_t *types, type;
    uoffset_t count;
    char type_name[FLATCC_JSON_PRINT_NAME_LEN_MAX + 5];
    flatcc_json_printer_union_descriptor_t ud;

    ud.ttl = td->ttl;
    if (len > FLATCC_JSON_PRINT_NAME_LEN_MAX) {
        RAISE_ERROR(bad_input);
        FLATCC_ASSERT(0 && "identifier too long");
        return;
    }
    memcpy(type_name, name, len);
    memcpy(type_name + len, "_type", 5);
    if (p && pt) {
        flatcc_json_printer_utype_enum_vector_field(ctx, td, id - 1,
                type_name, len + 5, ptf);
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        pt = read_uoffset_ptr(pt);
        count = __flatbuffers_uoffset_read_from_pe(p);
        ++p;
        ++pt;
        types = (utype_t *)pt;
        print_name(ctx, name, len);
        print_start('[');

        if (count) {
            type = __flatbuffers_utype_read_from_pe(types);
            if (type != 0) {
                ud.type = type;
                ud.member = p;
                pf(ctx, &ud);
            } else {
                print_null();
            }
            --count;
        }
        while (count--) {
            ++p;
            ++types;
            type = __flatbuffers_utype_read_from_pe(types);
            print_char(',');
            if (type != 0) {
                ud.type = type;
                ud.member = p;
                pf(ctx, &ud);
            } else {
                print_null();
            }
        }
        print_end(']');
    }
}